

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
VectorInstance::op_allIndexesOf
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  shared_ptr<Instance> *rhs;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator it;
  string indexes_str;
  shared_ptr<Instance> instance;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_c0 [32];
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  string local_90 [48];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_50;
  string local_48 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 == 1) {
    rhs = (shared_ptr<Instance> *)(in_RSI + 0x58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    get_shared_instance(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::string(local_48);
    local_50._M_current =
         (shared_ptr<Instance> *)
         std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                   ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    while( true ) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                          *)rhs,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator*(&local_50);
      in_stack_ffffffffffffff1f =
           InstanceIsEqualToComparator::operator()
                     ((InstanceIsEqualToComparator *)this_00,(shared_ptr<Instance> *)in_RDI,rhs);
      if ((bool)in_stack_ffffffffffffff1f) {
        lVar4 = std::__cxx11::string::size();
        if (lVar4 != 0) {
          std::__cxx11::string::operator+=(local_48,",");
        }
        in_stack_ffffffffffffff68 =
             std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             begin((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *
                   )CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        __gnu_cxx::operator-
                  ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                    *)rhs,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        std::__cxx11::to_string((long)in_stack_ffffffffffffff68._M_current);
        std::__cxx11::string::operator+=(local_48,local_90);
        std::__cxx11::string::~string(local_90);
      }
      in_stack_ffffffffffffff60 =
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
           ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                         *)in_RDI,(int)((ulong)rhs >> 0x20));
    }
    std::operator+((char *)in_stack_ffffffffffffff68._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60._M_current);
    std::operator+(in_RDI,(char *)rhs);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_48);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bf90d);
    return this_00;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_allIndexesOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::string indexes_str;
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            if (indexes_str.size() > 0)
                indexes_str += ",";
            indexes_str += std::to_string(it - _value.begin());
        }
    return "[" + indexes_str + "]";
}